

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

int VP8Decimate(VP8EncIterator *it,VP8ModeScore *rd,VP8RDLevel rd_opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  ushort uVar8;
  DError *paaiVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint8_t *puVar12;
  ushort uVar13;
  int iVar14;
  uint32_t uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  uint16_t *puVar24;
  VP8MBInfo *pVVar25;
  int8_t *piVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  ushort uVar30;
  uint8_t *puVar31;
  uint8_t *puVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ushort uVar36;
  long lVar37;
  long lVar38;
  VP8Encoder *pVVar39;
  uint8_t *puVar40;
  uint8_t *puVar41;
  VP8ModeScore *rd_00;
  VP8ModeScore *pVVar42;
  uint8_t *src;
  long lVar43;
  uint8_t *puVar44;
  long lVar45;
  VP8ModeScore *__src;
  ulong uVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  long local_478;
  long local_470;
  undefined1 local_468 [16];
  long local_450;
  long local_438;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  long local_388;
  undefined8 local_360 [64];
  int16_t local_160 [140];
  uint local_48;
  int8_t local_44 [3];
  int8_t local_40 [16];
  
  iVar22 = it->enc_->method_;
  rd->nz = 0;
  rd->D = 0;
  rd->SD = 0;
  rd->H = 0;
  rd->R = 0;
  local_438 = 0x7fffffffffffff;
  rd->score = 0x7fffffffffffff;
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);
  if (rd_opt != RD_OPT_NONE) {
    it->do_trellis_ = (uint)(RD_OPT_TRELLIS < rd_opt);
    puVar44 = it->yuv_in_;
    pVVar39 = it->enc_;
    uVar27 = *(byte *)it->mb_ >> 5 & 3;
    iVar19 = pVVar39->dqm_[uVar27].lambda_i16_;
    iVar20 = pVVar39->dqm_[uVar27].tlambda_;
    iVar14 = IsFlatSource16(puVar44);
    rd->mode_i16 = -1;
    rd_00 = (VP8ModeScore *)local_3a8;
    __src = rd;
    for (lVar37 = 0; lVar37 != 4; lVar37 = lVar37 + 1) {
      puVar31 = it->yuv_out2_;
      rd_00->mode_i16 = (int)lVar37;
      uVar15 = ReconstructIntra16(it,rd_00,puVar31,(int)lVar37);
      rd_00->nz = uVar15;
      iVar16 = (*VP8SSE16x16)(puVar44,puVar31);
      rd_00->D = (long)iVar16;
      if (iVar20 == 0) {
        lVar23 = 0;
      }
      else {
        iVar16 = (*VP8TDisto16x16)(puVar44,puVar31,kWeightY);
        lVar23 = (long)(iVar16 * iVar20 + 0x80 >> 8);
      }
      rd_00->SD = lVar23;
      rd_00->H = (ulong)VP8FixedCostsI16[lVar37];
      iVar16 = VP8GetCostLuma16(it,rd_00);
      rd_00->R = (long)iVar16;
      bVar47 = iVar14 != 0;
      iVar14 = 0;
      if ((bVar47) && (iVar16 = IsFlat_C(rd_00->y_ac_levels[0],0x10,0), iVar16 != 0)) {
        rd_00->D = rd_00->D * 2;
        rd_00->SD = rd_00->SD * 2;
        iVar14 = iVar16;
      }
      SetRDScore(iVar19,rd_00);
      if ((lVar37 == 0) || (pVVar42 = rd_00, rd_00->score < __src->score)) {
        uVar1 = it->yuv_out_;
        uVar4 = it->yuv_out2_;
        auVar48._8_4_ = (int)uVar1;
        auVar48._0_8_ = uVar4;
        auVar48._12_4_ = (int)((ulong)uVar1 >> 0x20);
        it->yuv_out_ = (uint8_t *)uVar4;
        it->yuv_out2_ = (uint8_t *)auVar48._8_8_;
        pVVar42 = __src;
        __src = rd_00;
      }
      rd_00 = pVVar42;
    }
    if (__src != rd) {
      memcpy(rd,__src,0x370);
    }
    SetRDScore(pVVar39->dqm_[uVar27].lambda_mode_,rd);
    VP8SetIntra16Mode(it,rd->mode_i16);
    if (((rd->nz & 0x100ffff) == 0x1000000) && ((long)pVVar39->dqm_[uVar27].min_disto_ < rd->D)) {
      uVar13 = rd->y_dc_levels[1];
      uVar8 = rd->y_dc_levels[2];
      uVar30 = -uVar13;
      if (0 < (short)uVar13) {
        uVar30 = uVar13;
      }
      uVar13 = -uVar8;
      if (0 < (short)uVar8) {
        uVar13 = uVar8;
      }
      uVar8 = rd->y_dc_levels[4];
      uVar36 = -uVar8;
      if (0 < (short)uVar8) {
        uVar36 = uVar8;
      }
      if (uVar30 < uVar13) {
        uVar30 = uVar13;
      }
      if (uVar36 <= uVar30) {
        uVar36 = uVar30;
      }
      if (pVVar39->dqm_[uVar27].max_edge_ < (int)(uint)uVar36) {
        pVVar39->dqm_[uVar27].max_edge_ = (uint)uVar36;
      }
    }
    pVVar39 = it->enc_;
    pVVar25 = it->mb_;
    puVar44 = it->yuv_in_;
    puVar31 = it->yuv_out2_;
    if (1 < iVar22) {
      if (pVVar39->max_i4_header_bits_ != 0) {
        uVar27 = *(byte *)pVVar25 >> 5 & 3;
        lVar37 = (long)pVVar39->dqm_[uVar27].lambda_i4_;
        iVar22 = pVVar39->dqm_[uVar27].tlambda_;
        local_48 = 0;
        local_3a8 = (undefined1  [16])0x0;
        local_398 = ZEXT816(0xd3);
        local_388 = (long)pVVar39->dqm_[uVar27].lambda_mode_ * 0xd3;
        VP8IteratorStartI4(it);
        puVar41 = rd->modes_i4;
        iVar19 = 0;
        do {
          uVar13 = VP8Scan[it->i4_];
          src = puVar44 + uVar13;
          puVar24 = GetCostModeI4(it,puVar41);
          puVar32 = puVar31 + uVar13;
          puVar40 = it->yuv_p_ + 0x688;
          (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
          lVar33 = 0;
          local_468._0_8_ = 0x7fffffffffffff;
          uVar21 = 0;
          uVar35 = 0;
          lVar45 = 0;
          lVar23 = 0;
          iVar20 = -1;
          for (lVar38 = 0; lVar38 != 10; lVar38 = lVar38 + 1) {
            iVar16 = ReconstructIntra4(it,(int16_t *)&local_3c8,src,puVar40,(int)lVar38);
            iVar14 = it->i4_;
            iVar17 = (*VP8SSE4x4)(src,puVar40);
            if (iVar22 == 0) {
              lVar28 = 0;
            }
            else {
              iVar18 = (*VP8TDisto4x4)(src,puVar40,kWeightY);
              lVar28 = (long)(iVar18 * iVar22 + 0x80 >> 8);
            }
            uVar46 = (ulong)puVar24[lVar38];
            if (lVar38 == 0) {
LAB_0012d64c:
              lVar43 = 0;
            }
            else {
              iVar18 = IsFlat_C((int16_t *)&local_3c8,1,3);
              lVar43 = 0x8c;
              if (iVar18 == 0) goto LAB_0012d64c;
            }
            lVar34 = (lVar28 + iVar17) * 0x100;
            puVar12 = puVar40;
            if ((iVar20 < 0) ||
               ((long)((lVar43 + uVar46) * lVar37 + lVar34) < (long)local_468._0_8_)) {
              iVar18 = VP8GetCostLuma4(it,(int16_t *)&local_3c8);
              lVar34 = (lVar43 + iVar18 + uVar46) * lVar37 + lVar34;
              if ((iVar20 < 0) || (lVar34 < (long)local_468._0_8_)) {
                lVar23 = (long)it->i4_;
                local_360[lVar23 * 4 + 2] = local_3b8;
                local_360[lVar23 * 4 + 3] = uStack_3b0;
                local_360[lVar23 * 4] = local_3c8;
                local_360[lVar23 * 4 + 1] = uStack_3c0;
                local_468._0_8_ = lVar34;
                puVar12 = puVar32;
                lVar23 = (long)iVar17;
                puVar32 = puVar40;
                lVar45 = lVar28;
                lVar33 = lVar43 + iVar18;
                uVar35 = uVar46;
                uVar21 = iVar16 << ((byte)iVar14 & 0x1f);
                iVar20 = (int)lVar38;
              }
            }
            puVar40 = puVar12;
          }
          local_3a8._8_8_ = local_3a8._8_8_ + lVar45;
          local_3a8._0_8_ = local_3a8._0_8_ + lVar23;
          local_398._8_8_ = local_398._8_8_ + lVar33;
          local_398._0_8_ = local_398._0_8_ + uVar35;
          local_48 = local_48 | uVar21;
          local_388 = (lVar23 + lVar45) * 0x100 +
                      (uVar35 + lVar33) * (long)pVVar39->dqm_[uVar27].lambda_mode_ + local_388;
          if ((rd->score <= local_388) ||
             (iVar19 = iVar19 + (int)uVar35, pVVar39->max_i4_header_bits_ < iVar19))
          goto LAB_0012d8c8;
          lVar23 = (long)it->i4_;
          if (puVar32 != puVar31 + VP8Scan[lVar23]) {
            (*VP8Copy4x4)(puVar32,puVar31 + VP8Scan[lVar23]);
            lVar23 = (long)it->i4_;
          }
          puVar41[lVar23] = (uint8_t)iVar20;
          it->left_nz_[it->i4_ >> 2] = (uint)(uVar21 != 0);
          it->top_nz_[it->i4_ & 3] = (uint)(uVar21 != 0);
          iVar20 = VP8IteratorRotateI4(it,puVar31);
        } while (iVar20 != 0);
        rd->D = local_3a8._0_8_;
        rd->SD = local_3a8._8_8_;
        rd->H = local_398._0_8_;
        rd->R = local_398._8_8_;
        rd->nz = local_48;
        rd->score = local_388;
        VP8SetIntra4Mode(it,puVar41);
        uVar2 = it->yuv_out_;
        uVar5 = it->yuv_out2_;
        auVar49._8_4_ = (int)uVar2;
        auVar49._0_8_ = uVar5;
        auVar49._12_4_ = (int)((ulong)uVar2 >> 0x20);
        it->yuv_out_ = (uint8_t *)uVar5;
        it->yuv_out2_ = (uint8_t *)auVar49._8_8_;
        memcpy(rd->y_ac_levels,local_360,0x200);
      }
LAB_0012d8c8:
      pVVar39 = it->enc_;
      pVVar25 = it->mb_;
      puVar44 = it->yuv_in_;
      puVar31 = it->yuv_out2_;
    }
    iVar22 = pVVar39->dqm_[*(byte *)pVVar25 >> 5 & 3].lambda_uv_;
    puVar31 = puVar31 + 0x10;
    puVar40 = it->yuv_out_ + 0x10;
    rd->mode_uv = -1;
    local_468 = (undefined1  [16])0x0;
    lVar23 = 0;
    uVar27 = 0;
    lVar37 = 0;
    puVar41 = puVar40;
    for (lVar45 = 0; lVar45 != 4; lVar45 = lVar45 + 1) {
      local_48 = ReconstructUV(it,(VP8ModeScore *)local_3a8,puVar31,(int)lVar45);
      iVar19 = (*VP8SSE16x8)(puVar44 + 0x10,puVar31);
      auVar48 = local_398;
      local_3a8._8_8_ = 0;
      local_3a8._0_8_ = (long)iVar19;
      local_398._2_6_ = 0;
      local_398._0_2_ = VP8FixedCostsUV[lVar45];
      local_398._8_8_ = auVar48._8_8_;
      iVar19 = VP8GetCostUV(it,(VP8ModeScore *)local_3a8);
      lVar33 = (long)iVar19;
      local_398._8_8_ = lVar33;
      if (lVar45 != 0) {
        iVar19 = IsFlat_C(local_160,8,2);
        if (iVar19 != 0) {
          lVar33 = lVar33 + 0x460;
        }
      }
      uVar21 = local_48;
      uVar11 = local_398._0_8_;
      lVar38 = (local_3a8._8_8_ + local_3a8._0_8_) * 0x100 +
               (local_398._0_8_ + lVar33) * (long)iVar22;
      if ((lVar45 == 0) || (puVar32 = puVar41, lVar38 < local_438)) {
        local_468 = local_3a8;
        rd->mode_uv = (int)lVar45;
        memcpy(rd->uv_levels,local_160,0x100);
        puVar32 = puVar31;
        lVar37 = lVar33;
        puVar31 = puVar41;
        local_438 = lVar38;
        lVar23 = uVar11;
        uVar27 = uVar21;
        if (it->top_derr_ != (DError *)0x0) {
          *(undefined2 *)(rd->derr[1] + 1) = local_40._0_2_;
          *(undefined4 *)rd->derr = _local_44;
        }
      }
      puVar41 = puVar32;
    }
    VP8SetIntraUVMode(it,rd->mode_uv);
    rd->D = rd->D + local_468._0_8_;
    rd->SD = rd->SD + local_468._8_8_;
    rd->R = rd->R + lVar37;
    rd->H = rd->H + lVar23;
    rd->nz = rd->nz | uVar27;
    rd->score = rd->score + local_438;
    if (puVar41 != puVar40) {
      (*VP8Copy16x8)(puVar41,puVar40);
    }
    if (it->top_derr_ != (DError *)0x0) {
      piVar26 = rd->derr[0] + 2;
      for (lVar37 = 0x159; lVar37 != 0x15d; lVar37 = lVar37 + 2) {
        iVar22 = it->x_;
        paaiVar9 = it->top_derr_;
        it->i4_boundary_[lVar37 + -0x51] = (*(int8_t (*) [3])(piVar26 + -2))[0];
        it->i4_boundary_[lVar37 + -0x50] = (uint8_t)((uint)(*piVar26 * 3) >> 2);
        paaiVar9[(long)iVar22 + -0x57][1][lVar37 + 1] = piVar26[-1];
        paaiVar9[(long)iVar22 + -0x56][0][lVar37] = *piVar26 - it->i4_boundary_[lVar37 + -0x50];
        piVar26 = piVar26 + 3;
      }
    }
    if (rd_opt == RD_OPT_TRELLIS) {
      it->do_trellis_ = 1;
      if (((uint)*it->mb_ & 3) == 1) {
        uVar21 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
      }
      else {
        pVVar39 = it->enc_;
        VP8IteratorStartI4(it);
        uVar21 = 0;
        do {
          uVar27 = it->i4_;
          uVar13 = VP8Scan[(int)uVar27];
          bVar7 = it->preds_[(int)(((int)uVar27 >> 2) * pVVar39->preds_w_ + (uVar27 & 3))];
          puVar44 = it->yuv_in_;
          puVar31 = it->yuv_out_;
          (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
          iVar22 = ReconstructIntra4(it,rd->y_ac_levels[it->i4_],puVar44 + uVar13,puVar31 + uVar13,
                                     (uint)bVar7);
          uVar21 = uVar21 | iVar22 << ((byte)it->i4_ & 0x1f);
          iVar22 = VP8IteratorRotateI4(it,it->yuv_out_);
        } while (iVar22 != 0);
      }
      uVar27 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
      uVar27 = uVar27 | uVar21;
      rd->nz = uVar27;
    }
    else {
      uVar27 = rd->nz;
    }
    goto LAB_0012e08f;
  }
  local_478 = it->enc_->dqm_[*(byte *)it->mb_ >> 5 & 3].i4_penalty_;
  bVar47 = 1 < iVar22;
  if (iVar22 < 2) {
    local_470 = 0x7fffffffffffff;
    local_468._0_8_ = 0x7fffffffffffff;
    if ((*(byte *)it->mb_ & 3) == 1) goto LAB_0012dc4c;
LAB_0012de17:
    VP8IteratorStartI4(it);
    puVar44 = rd->modes_i4;
    local_450 = 0;
    uVar21 = 0;
    do {
      uVar13 = VP8Scan[it->i4_];
      puVar31 = it->yuv_in_;
      puVar24 = GetCostModeI4(it,puVar44);
      (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
      uVar35 = 0xffffffffffffffff;
      lVar37 = 0x7fffffffffffff;
      for (uVar46 = 0; uVar46 != 10; uVar46 = uVar46 + 1) {
        iVar19 = (*VP8SSE4x4)(puVar31 + uVar13,it->yuv_p_ + VP8I4ModeOffsets[uVar46]);
        lVar23 = (ulong)puVar24[uVar46] * 0xb + (long)iVar19 * 0x100;
        if (lVar23 < lVar37) {
          uVar35 = uVar46;
        }
        uVar35 = uVar35 & 0xffffffff;
        if (lVar23 <= lVar37) {
          lVar37 = lVar23;
        }
      }
      uVar8 = puVar24[(int)uVar35];
      puVar44[it->i4_] = (uint8_t)uVar35;
      local_478 = local_478 + lVar37;
      if (((long)local_468._0_8_ <= local_478) ||
         (local_450 = local_450 + (ulong)uVar8, local_470 < local_450)) goto LAB_0012dfa6;
      iVar19 = ReconstructIntra4(it,rd->y_ac_levels[it->i4_],puVar31 + uVar13,
                                 it->yuv_out2_ + VP8Scan[it->i4_],(int)uVar35);
      uVar21 = uVar21 | iVar19 << ((byte)it->i4_ & 0x1f);
      iVar19 = VP8IteratorRotateI4(it,it->yuv_out2_);
    } while (iVar19 != 0);
    VP8SetIntra4Mode(it,puVar44);
    uVar3 = it->yuv_out_;
    uVar6 = it->yuv_out2_;
    auVar50._8_4_ = (int)uVar3;
    auVar50._0_8_ = uVar6;
    auVar50._12_4_ = (int)((ulong)uVar3 >> 0x20);
    it->yuv_out_ = (uint8_t *)uVar6;
    it->yuv_out2_ = (uint8_t *)auVar50._8_8_;
    local_468._0_8_ = local_478;
  }
  else {
    local_470 = (long)it->enc_->mb_header_limit_;
LAB_0012dc4c:
    puVar44 = it->yuv_in_;
    uVar35 = 0xffffffffffffffff;
    local_468._0_8_ = 0x7fffffffffffff;
    for (uVar46 = 0; iVar19 = (int)uVar35, uVar46 != 4; uVar46 = uVar46 + 1) {
      iVar19 = (*VP8SSE16x16)(puVar44,it->yuv_p_ + VP8I16ModeOffsets[uVar46]);
      uVar29 = (ulong)VP8FixedCostsI16[uVar46];
      lVar37 = uVar29 * 0x6a + (long)iVar19 * 0x100;
      uVar10 = uVar46;
      if ((long)local_468._0_8_ <= lVar37) {
        lVar37 = local_468._0_8_;
        uVar10 = uVar35;
      }
      if (uVar46 == 0 || (long)uVar29 <= local_470) {
        uVar35 = uVar10;
      }
      uVar35 = uVar35 & 0xffffffff;
      if (uVar46 == 0 || (long)uVar29 <= local_470) {
        local_468._0_8_ = lVar37;
      }
    }
    iVar20 = 0;
    if (it->x_ == 0) {
LAB_0012ddea:
      iVar14 = IsFlatSource16(puVar44);
      if (iVar14 != 0) {
        iVar19 = iVar20;
      }
      bVar47 = iVar14 == 0 && bVar47;
    }
    else if (it->y_ == 0) {
      iVar20 = 2;
      goto LAB_0012ddea;
    }
    VP8SetIntra16Mode(it,iVar19);
    if (bVar47) goto LAB_0012de17;
LAB_0012dfa6:
    uVar21 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
  }
  if (0 < iVar22) {
    puVar44 = it->yuv_in_;
    uVar35 = 0xffffffffffffffff;
    for (uVar46 = 0; uVar46 != 4; uVar46 = uVar46 + 1) {
      iVar22 = (*VP8SSE16x8)(puVar44 + 0x10,it->yuv_p_ + VP8UVModeOffsets[uVar46]);
      lVar37 = (ulong)VP8FixedCostsUV[uVar46] * 0x78 + (long)iVar22 * 0x100;
      if (lVar37 < local_438) {
        uVar35 = uVar46;
      }
      uVar35 = uVar35 & 0xffffffff;
      if (lVar37 <= local_438) {
        local_438 = lVar37;
      }
    }
    VP8SetIntraUVMode(it,(int)uVar35);
  }
  uVar27 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
  uVar27 = uVar27 | uVar21;
  rd->nz = uVar27;
  rd->score = local_468._0_8_;
LAB_0012e08f:
  VP8SetSkip(it,(uint)(uVar27 == 0));
  return (uint)(uVar27 == 0);
}

Assistant:

int VP8Decimate(VP8EncIterator* const it, VP8ModeScore* const rd,
                VP8RDLevel rd_opt) {
  int is_skipped;
  const int method = it->enc_->method_;

  InitScore(rd);

  // We can perform predictions for Luma16x16 and Chroma8x8 already.
  // Luma4x4 predictions needs to be done as-we-go.
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);

  if (rd_opt > RD_OPT_NONE) {
    it->do_trellis_ = (rd_opt >= RD_OPT_TRELLIS_ALL);
    PickBestIntra16(it, rd);
    if (method >= 2) {
      PickBestIntra4(it, rd);
    }
    PickBestUV(it, rd);
    if (rd_opt == RD_OPT_TRELLIS) {   // finish off with trellis-optim now
      it->do_trellis_ = 1;
      SimpleQuantize(it, rd);
    }
  } else {
    // At this point we have heuristically decided intra16 / intra4.
    // For method >= 2, pick the best intra4/intra16 based on SSE (~tad slower).
    // For method <= 1, we don't re-examine the decision but just go ahead with
    // quantization/reconstruction.
    RefineUsingDistortion(it, (method >= 2), (method >= 1), rd);
  }
  is_skipped = (rd->nz == 0);
  VP8SetSkip(it, is_skipped);
  return is_skipped;
}